

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::RaiseScope(cmMakefile *this,string *var,char *varDef)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream m;
  string local_1b0;
  ostringstream local_190 [376];
  
  if (var->_M_string_length != 0) {
    bVar1 = Internals::RaiseScope((this->Internal).x_,var,varDef,this);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar2 = std::operator<<((ostream *)local_190,"Cannot set \"");
      poVar2 = std::operator<<(poVar2,(string *)var);
      std::operator<<(poVar2,"\": current scope has no parent.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
    }
  }
  return;
}

Assistant:

cmSourceFile*
cmMakefile::AddCustomCommandToOutput(const std::string& output,
                                     const std::vector<std::string>& depends,
                                     const std::string& main_dependency,
                                     const cmCustomCommandLines& commandLines,
                                     const char* comment,
                                     const char* workingDir,
                                     bool replace,
                                     bool escapeOldStyle,
                                     bool uses_terminal)
{
  std::vector<std::string> outputs;
  outputs.push_back(output);
  std::vector<std::string> no_byproducts;
  return this->AddCustomCommandToOutput(outputs, no_byproducts,
                                        depends, main_dependency,
                                        commandLines, comment, workingDir,
                                        replace, escapeOldStyle,
                                        uses_terminal);
}